

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall amrex::FabArray<amrex::IArrayBox>::clear(FabArray<amrex::IArrayBox> *this)

{
  bool bVar1;
  reference ppIVar2;
  Long LVar3;
  pointer pFVar4;
  iterator tag;
  iterator nbytes_00;
  vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  iterator __end3;
  iterator __begin3;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  IArrayBox *x;
  iterator __end0;
  iterator __begin0;
  vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *__range2;
  Long nbytes;
  reference in_stack_ffffffffffffffb0;
  FabArrayBase *in_stack_ffffffffffffffd0;
  __normal_iterator<amrex::IArrayBox_**,_std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>_>
  local_20;
  undefined8 in_stack_ffffffffffffffe8;
  FabArrayBase *in_stack_fffffffffffffff0;
  long lVar5;
  
  if (((ulong)in_RDI[10].super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    *(undefined1 *)
     &in_RDI[10].super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = 0;
    FabArrayBase::clearThisBD
              (in_stack_fffffffffffffff0,SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
  }
  lVar5 = 0;
  local_20._M_current =
       (IArrayBox **)
       std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::begin(in_RDI);
  std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<amrex::IArrayBox_**,_std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (__normal_iterator<amrex::IArrayBox_**,_std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>_>
                             *)in_RDI), bVar1) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<amrex::IArrayBox_**,_std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = (FabArrayBase *)*ppIVar2;
    if (in_stack_ffffffffffffffd0 != (FabArrayBase *)0x0) {
      LVar3 = nBytesOwned<int>((BaseFab<int> *)0x7e5b4c);
      lVar5 = LVar3 + lVar5;
      pFVar4 = std::
               unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
               ::operator->((unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
                             *)0x7e5b66);
      (*pFVar4->_vptr_FabFactory[4])(pFVar4,in_stack_ffffffffffffffd0);
    }
    __gnu_cxx::
    __normal_iterator<amrex::IArrayBox_**,_std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>_>
    ::operator++(&local_20);
  }
  std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::clear
            ((vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *)0x7e5b92);
  free(in_RDI[0xc].super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
       _M_impl.super__Vector_impl_data._M_start);
  in_RDI[0xc].super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  ::reset((unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
           *)in_stack_ffffffffffffffb0,(pointer)in_RDI);
  in_RDI[10].super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < lVar5) {
    tag = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI);
    nbytes_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_RDI), bVar1) {
      in_stack_ffffffffffffffb0 =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&stack0xffffffffffffffc0);
      FabArrayBase::updateMemUsage
                (tag._M_current,(Long)nbytes_00._M_current,(Arena *)in_stack_ffffffffffffffb0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&stack0xffffffffffffffc0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x7e5c5e);
  FabArrayBase::clear(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void
FabArray<FAB>::clear ()
{
    if (define_function_called)
    {
        define_function_called = false;
        clearThisBD();  //!< addThisBD is called in define
    }

    Long nbytes = 0L;
    for (auto x : m_fabs_v) {
        if (x) {
            nbytes += amrex::nBytesOwned(*x);
            m_factory->destroy(x);
        }
    }
    m_fabs_v.clear();
#ifdef AMREX_USE_GPU
    The_Pinned_Arena()->free(m_hp_arrays);
    The_Arena()->free(m_dp_arrays);
    m_dp_arrays = nullptr;
#else
    std::free(m_hp_arrays);
#endif
    m_hp_arrays = nullptr;
    m_factory.reset();
    m_dallocator.m_arena = nullptr;
    // no need to clear the non-blocking fillboundary stuff

    if (nbytes > 0) {
        for (auto const& t : m_tags) {
            updateMemUsage(t, -nbytes, nullptr);
        }
    }
    m_tags.clear();

    FabArrayBase::clear();
}